

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O2

vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_> *
__thiscall
VFS::CVFS::CVFSDir::GetChilds
          (vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
           *__return_storage_ptr__,CVFSDir *this)

{
  mutex *__mutex;
  long lVar1;
  
  __mutex = &(this->super_CVFSNode).m_UpdateLock;
  std::mutex::lock(__mutex);
  lVar1 = std::chrono::_V2::system_clock::now();
  (this->super_CVFSNode).m_Accessed = lVar1 / 1000000000;
  std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>::
  vector(__return_storage_ptr__,&this->m_Childs);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return __return_storage_ptr__;
}

Assistant:

std::vector<VFSNode> GetChilds()
                    {
                        std::lock_guard<std::mutex> lock(m_UpdateLock);
                        m_Accessed = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());
                        return m_Childs;
                    }